

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

void __thiscall Namespace<false>::AddFeature(Namespace<false> *this,vw *all,char *str)

{
  features *this_00;
  uint64_t uVar1;
  substring sVar2;
  allocator local_41;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  this_00 = this->ftrs;
  std::__cxx11::string::string((string *)&local_40,str,&local_41);
  sVar2.end = local_40 + local_38;
  sVar2.begin = local_40;
  uVar1 = (*all->p->hasher)(sVar2,this->namespace_hash);
  features::push_back(this_00,1.0,uVar1 & all->parse_mask);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  this->feature_count = this->feature_count + 1;
  return;
}

Assistant:

void AddFeature(vw* all, const char* str)
  {
    ftrs->push_back(1., VW::hash_feature(*all, str, namespace_hash));
    feature_count++;

    if (audit)
      ftrs->space_names.push_back(audit_strings_ptr(new audit_strings(name, str)));
  }